

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O1

int __thiscall dic::dictRelese(dic *this,int dictidx)

{
  pointer *ppdVar1;
  void *pvVar2;
  dict *__last;
  void *pvVar3;
  pointer pdVar4;
  long lVar5;
  dict *__first;
  ulong uVar6;
  
  lVar5 = (long)dictidx;
  pdVar4 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar4[lVar5].ht[0].size != 0) {
    uVar6 = 0;
    do {
      pvVar3 = *(void **)((long)pdVar4[lVar5].ht[0].table + uVar6 * 8);
      while (pvVar3 != (void *)0x0) {
        pvVar2 = *(void **)((long)pvVar3 + 0x10);
        operator_delete(pvVar3);
        pvVar3 = pvVar2;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pdVar4 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < pdVar4[lVar5].ht[0].size);
  }
  if ((pdVar4[lVar5].rehashidx != -1) &&
     (pdVar4 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start,
     *(unsigned_long *)((long)(pdVar4[lVar5].ht + 1) + 8) != 0)) {
    uVar6 = 0;
    do {
      pvVar3 = *(void **)((long)pdVar4[lVar5].ht[1].table + uVar6 * 8);
      while (pvVar3 != (void *)0x0) {
        pvVar2 = *(void **)((long)pvVar3 + 0x10);
        operator_delete(pvVar3);
        pvVar3 = pvVar2;
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      pdVar4 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
               super__Vector_impl_data._M_start;
    } while (uVar6 < *(unsigned_long *)((long)(pdVar4[lVar5].ht + 1) + 8));
  }
  pdVar4 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start;
  __last = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = pdVar4 + lVar5 + 1;
  if (__first != __last) {
    std::__copy_move<true,false,std::random_access_iterator_tag>::__copy_m<dict*,dict*>
              (__first,__last,pdVar4 + lVar5);
  }
  ppdVar1 = &(this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
             super__Vector_impl_data._M_finish;
  *ppdVar1 = *ppdVar1 + -1;
  return 1;
}

Assistant:

int dic::dictRelese(int dictidx){
    dictEntry *fetch=NULL;
    dictEntry *tmp=NULL;
    //relese ht
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  
    if(dc[dictidx].rehashidx!=-1){
        for(unsigned int i=0;i<dc[dictidx].ht[1].size;i++){
            fetch=dc[dictidx].ht[1].table[i];
            while(fetch!=NULL){
                tmp=fetch;
                fetch=fetch->next;
                delete tmp;
                tmp=NULL;
            }
        }  
    } 
    //delete database
    dc.erase(dc.begin()+dictidx);

    return 1;
}